

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::RedirectAddressComputation
          (CodeGenGenericContext *this,x86Reg *index,int *multiplier,x86Reg *base,uint *shift)

{
  uint *shift_local;
  x86Reg *base_local;
  int *multiplier_local;
  x86Reg *index_local;
  CodeGenGenericContext *this_local;
  
  if (this->genReg[*index].type == argReg) {
    *index = this->genReg[*index].field_1.reg;
  }
  if (this->genReg[*base].type == argReg) {
    *base = this->genReg[*base].field_1.reg;
  }
  if (this->genReg[*base].type == argNumber) {
    *shift = this->genReg[*base].field_1.reg + *shift;
    *base = rNONE;
  }
  if (this->genReg[*index].type == argNumber) {
    *shift = this->genReg[*index].field_1.reg * *multiplier + *shift;
    *multiplier = 1;
    *index = rNONE;
  }
  return;
}

Assistant:

void CodeGenGenericContext::RedirectAddressComputation(x86Reg &index, int &multiplier, x86Reg &base, unsigned &shift)
{
	// If selected index register contains the value of another register, use it instead
	if(genReg[index].type == x86Argument::argReg)
	{
		index = genReg[index].reg;
	}

	// If selected base register contains the value of another register, use it instead
	if(genReg[base].type == x86Argument::argReg)
	{
		base = genReg[base].reg;
	}

	// If the base register contains a known value, add it to the offset and don't use the base register
	if(genReg[base].type == x86Argument::argNumber)
	{
		shift += genReg[base].num;
		base = rNONE;
	}

	// If the index register contains a known value, add it to the offset and don't use the index register
	if(genReg[index].type == x86Argument::argNumber)
	{
		shift += genReg[index].num * multiplier;
		multiplier = 1;
		index = rNONE;
	}
}